

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O1

void test_skiplist_query_exist_populated_single(planck_unit_test_t *tc)

{
  uint uVar1;
  bool bVar2;
  planck_unit_result_t pVar3;
  ion_status_t iVar4;
  ulong uVar5;
  int key;
  ion_byte_t value [10];
  ion_byte_t test_value [10];
  ion_skiplist_t skiplist;
  uint local_84 [2];
  char local_7c [10];
  char local_72 [10];
  ion_skiplist_t local_68;
  
  sl_initialize(&local_68,key_type_numeric_signed,4,10,7,1,4);
  local_68.super.compare = dictionary_compare_signed_value;
  local_84[0] = 0;
  uVar5 = 0;
  do {
    sprintf(local_72,"Find %d",uVar5);
    iVar4 = sl_insert(&local_68,local_84,local_72);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(iVar4.error == '\0'),0x2f6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00102b1b;
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar4 & 0xffffffff00000000) == 0x100000000),0x2f7,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00102b1b;
    uVar1 = local_84[0] + 2;
    uVar5 = (ulong)uVar1;
    bVar2 = (int)local_84[0] < 0x62;
    local_84[0] = uVar1;
  } while (bVar2);
  local_84[1] = 0x18;
  iVar4 = sl_get(&local_68,local_84 + 1,local_7c);
  pVar3 = planck_unit_assert_true
                    (tc,(uint)(iVar4.error == '\0'),0x303,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar3 != '\0') {
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar4 & 0xffffffff00000000) == 0x100000000),0x304,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 != '\0') {
      pVar3 = planck_unit_assert_str_are_equal
                        (tc,local_7c,"Find 24",0x305,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                        );
      if (pVar3 != '\0') {
        sl_destroy(&local_68);
        return;
      }
    }
  }
LAB_00102b1b:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_query_exist_populated_single(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t test_value[10];

	int i;

	for (i = 0; i < 100; i += 2) {
		sprintf((char *) test_value, "Find %d", i);

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, test_value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	int			key		= 24;
	ion_byte_t	value[10];

	ion_status_t status = sl_get(&skiplist, (ion_key_t) &key, value);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, "Find 24");

	sl_destroy(&skiplist);
}